

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O1

t_object * __thiscall
xemmai::t_type_of<xemmai::t_object>::
f_derive<xemmai::t_derived<xemmai::t_type_of<std::filesystem::perms>>>
          (t_type_of<xemmai::t_object> *this,t_object *a_module,t_fields *a_fields)

{
  t_type *ptVar1;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  undefined8 *puVar2;
  t_object *ptVar3;
  t_object *a_module_local;
  unsigned_long local_80;
  t_type_of<xemmai::t_object> *local_78;
  undefined1 local_70 [72];
  
  a_module_local = a_module;
  xemmai::t_type_of<xemmai::t_object>::f_merge((t_fields *)local_70);
  puVar2 = (undefined8 *)__tls_get_addr(&PTR_0011ed08);
  ptVar3 = t_engine::
           f_allocate_for_type<xemmai::t_derived<xemmai::t_type_of<std::filesystem::perms>>>
                     ((t_engine *)*puVar2,
                      ((long)(local_70._8_8_ - local_70._0_8_) >> 3) * -0x5555555555555555);
  local_80 = ((long)(a_fields->v_instance).
                    super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(a_fields->v_instance).
                    super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + this->v_instance_fields;
  local_78 = this;
  t_derived<xemmai::t_type_of<std::filesystem::perms>>::
  t_derived<std::array<void_const*,3ul>const&,xemmai::t_type_of<xemmai::t_object>*,xemmai::t_object*&,unsigned_long_const&,unsigned_long,std::vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>&,std::map<xemmai::t_object*,unsigned_long,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>&>
            ((t_derived<xemmai::t_type_of<std::filesystem::perms>> *)ptVar3->v_data,
             &t_bears<std::filesystem::perms,_xemmai::t_type_of<long>_>::c_IDS,&local_78,
             &a_module_local,&t_derives<std::filesystem::perms,_xemmai::t_type_of<long>_>::c_NATIVE,
             &local_80,
             (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
              *)local_70,
             (map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
              *)(local_70 + 0x18));
  ptVar1 = (t_type *)this[-1].f_or;
  puVar2 = (undefined8 *)__tls_get_addr(&PTR_0011ece0);
  this_00 = (t_queue<128UL> *)*puVar2;
  *this_00->v_head = (t_object *)&ptVar1[-1].f_less;
  if (this_00->v_head == this_00->v_next) {
    t_slot::t_queue<128UL>::f_next(this_00);
  }
  else {
    this_00->v_head = this_00->v_head + 1;
  }
  ptVar3->v_type = ptVar1;
  puVar2 = (undefined8 *)__tls_get_addr(&PTR_0011ed30);
  this_01 = (t_queue<256UL> *)*puVar2;
  *this_01->v_head = ptVar3;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<256UL>::f_next(this_01);
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  std::
  _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
               *)(local_70 + 0x18));
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
             *)local_70);
  return ptVar3;
}

Assistant:

t_object* t_type::f_derive(t_object* a_module, const t_fields& a_fields)
{
	auto [fields, key2index] = f_merge(a_fields);
	auto p = f_engine()->f_allocate_for_type<T>(fields.size());
	new(p->f_data()) T(T::c_IDS, this, a_module, T::c_NATIVE, v_instance_fields + a_fields.v_instance.size(), fields, key2index);
	p->f_be(t_object::f_of(this)->v_type);
	return p;
}